

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexNoise.cpp
# Opt level: O0

float __thiscall SimplexNoise::fractal(SimplexNoise *this,size_t octaves,float x,float y)

{
  float fVar1;
  ulong local_38;
  size_t i;
  float local_28;
  float amplitude;
  float frequency;
  float output;
  float y_local;
  float x_local;
  size_t octaves_local;
  SimplexNoise *this_local;
  
  amplitude = 0.0;
  local_28 = this->mFrequency;
  i._4_4_ = this->mAmplitude;
  for (local_38 = 0; local_38 < octaves; local_38 = local_38 + 1) {
    fVar1 = noise(x * local_28,y * local_28);
    amplitude = i._4_4_ * fVar1 + amplitude;
    local_28 = this->mLacunarity * local_28;
    i._4_4_ = this->mPersistence * i._4_4_;
  }
  return amplitude;
}

Assistant:

float SimplexNoise::fractal(size_t octaves, float x, float y) const {
    float output = 0.f;
    float frequency = mFrequency;
    float amplitude = mAmplitude;

    for (size_t i = 0; i < octaves; i++) {
        output += (amplitude * noise(x * frequency, y * frequency));

        frequency *= mLacunarity;
        amplitude *= mPersistence;
    }

    return output;
}